

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O1

string_view __thiscall
ResolveGenericCommand::getHelp(ResolveGenericCommand *this,string_view parameters)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  
  rhs._M_str = "hostname";
  rhs._M_len = 8;
  bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
  pcVar2 = "Resolves a hostname to an IP address. Syntax: resolve hostname <address>";
  uVar3 = 0x48;
  if (!bVar1) {
    rhs_00._M_str = "host";
    rhs_00._M_len = 4;
    bVar1 = jessilib::equalsi<char,char>(parameters,rhs_00);
    if (!bVar1) {
      rhs_01._M_str = "ip";
      rhs_01._M_len = 2;
      bVar1 = jessilib::equalsi<char,char>(parameters,rhs_01);
      uVar3 = (ulong)bVar1 ^ 0x4b;
      pcVar2 = "Resolves an IP address or hostname. Syntax: resolve <hostname|ip> <address>";
      if (bVar1) {
        pcVar2 = "Reverse-resolves an IP address to a hostname. Syntax: resolve ip <address>";
      }
    }
  }
  sVar4._M_str = pcVar2;
  sVar4._M_len = uVar3;
  return sVar4;
}

Assistant:

std::string_view ResolveGenericCommand::getHelp(std::string_view parameters)
{
	static constexpr std::string_view defaultHelp = "Resolves an IP address or hostname. Syntax: resolve <hostname|ip> <address>"sv;
	static constexpr std::string_view hostHelp = "Resolves a hostname to an IP address. Syntax: resolve hostname <address>"sv;
	static constexpr std::string_view ipHelp = "Reverse-resolves an IP address to a hostname. Syntax: resolve ip <address>"sv;

	if (jessilib::equalsi(parameters, "hostname"sv) || jessilib::equalsi(parameters, "host"sv))
		return hostHelp;
	if (jessilib::equalsi(parameters, "ip"sv))
		return ipHelp;

	return defaultHelp;
}